

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_textedit_redo(nk_text_edit *state)

{
  short *psVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  nk_text_undo_record *pnVar5;
  long lVar6;
  int pos;
  uint uVar7;
  int len_00;
  int len;
  nk_rune local_54;
  int local_50;
  int local_4c;
  ulong local_48;
  long local_40;
  int local_34;
  ulong uVar8;
  
  lVar6 = (long)(state->undo).redo_point;
  if (lVar6 != 99) {
    sVar2 = (state->undo).undo_point;
    pos = (state->undo).undo_rec[lVar6].where;
    sVar3 = (state->undo).undo_rec[lVar6].insert_length;
    len_00 = (int)sVar3;
    sVar4 = (state->undo).undo_rec[lVar6].delete_length;
    uVar7 = (uint)sVar4;
    uVar8 = (ulong)uVar7;
    lVar6 = (long)(state->undo).undo_rec[lVar6].char_storage;
    (state->undo).undo_rec[sVar2].delete_length = sVar3;
    (state->undo).undo_rec[sVar2].insert_length = sVar4;
    (state->undo).undo_rec[sVar2].where = pos;
    (state->undo).undo_rec[sVar2].char_storage = -1;
    if (uVar7 != 0) {
      sVar3 = (state->undo).undo_char_point;
      local_50 = len_00;
      local_4c = pos;
      local_48 = uVar8;
      local_40 = lVar6;
      if ((int)(state->undo).redo_char_point < (int)((int)sVar3 + uVar7)) {
        pnVar5 = (state->undo).undo_rec + sVar2;
        pnVar5->insert_length = 0;
        pnVar5->delete_length = 0;
      }
      else {
        (state->undo).undo_rec[sVar2].char_storage = sVar3;
        (state->undo).undo_char_point = sVar3 + sVar4;
        if (0 < (state->undo).undo_rec[sVar2].insert_length) {
          lVar6 = 0;
          do {
            local_54 = 0;
            nk_str_at_const(&state->string,(state->undo).undo_rec[sVar2].where + (int)lVar6,
                            &local_54,&local_34);
            (state->undo).undo_char[(state->undo).undo_rec[sVar2].char_storage + lVar6] = local_54;
            lVar6 = lVar6 + 1;
          } while ((int)lVar6 < (int)(state->undo).undo_rec[sVar2].insert_length);
        }
      }
      pos = local_4c;
      nk_str_delete_runes(&state->string,local_4c,(int)local_48);
      lVar6 = local_40;
      len_00 = local_50;
    }
    if ((short)len_00 != 0) {
      nk_str_insert_text_runes(&state->string,pos,(state->undo).undo_char + lVar6,len_00);
    }
    state->cursor = pos + len_00;
    psVar1 = &(state->undo).undo_point;
    *psVar1 = *psVar1 + 1;
    psVar1 = &(state->undo).redo_point;
    *psVar1 = *psVar1 + 1;
  }
  return;
}

Assistant:

NK_API void
nk_textedit_redo(struct nk_text_edit *state)
{
    struct nk_text_undo_state *s = &state->undo;
    struct nk_text_undo_record *u, r;
    if (s->redo_point == NK_TEXTEDIT_UNDOSTATECOUNT)
        return;

    /* we need to do two things: apply the redo record, and create an undo record */
    u = &s->undo_rec[s->undo_point];
    r = s->undo_rec[s->redo_point];

    /* we KNOW there must be room for the undo record, because the redo record
    was derived from an undo record */
    u->delete_length = r.insert_length;
    u->insert_length = r.delete_length;
    u->where = r.where;
    u->char_storage = -1;

    if (r.delete_length) {
        /* the redo record requires us to delete characters, so the undo record
        needs to store the characters */
        if (s->undo_char_point + u->insert_length > s->redo_char_point) {
            u->insert_length = 0;
            u->delete_length = 0;
        } else {
            int i;
            u->char_storage = s->undo_char_point;
            s->undo_char_point = (short)(s->undo_char_point + u->insert_length);

            /* now save the characters */
            for (i=0; i < u->insert_length; ++i) {
                s->undo_char[u->char_storage + i] =
                    nk_str_rune_at(&state->string, u->where + i);
            }
        }
        nk_str_delete_runes(&state->string, r.where, r.delete_length);
    }

    if (r.insert_length) {
        /* easy case: need to insert n characters */
        nk_str_insert_text_runes(&state->string, r.where,
            &s->undo_char[r.char_storage], r.insert_length);
    }
    state->cursor = r.where + r.insert_length;

    s->undo_point++;
    s->redo_point++;
}